

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_add_zinv_var
               (secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *bzinv)

{
  int iVar1;
  long lVar2;
  secp256k1_fe local_218;
  secp256k1_fe z12;
  secp256k1_fe az;
  secp256k1_fe local_198;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe local_d8;
  secp256k1_fe s2;
  secp256k1_fe t;
  secp256k1_fe h3;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      secp256k1_fe_impl_mul(&az,&a->z,bzinv);
      secp256k1_fe_impl_sqr(&z12,&az);
      u1.n[4] = (a->x).n[4];
      u1.n[0] = (a->x).n[0];
      u1.n[1] = (a->x).n[1];
      u1.n[2] = (a->x).n[2];
      u1.n[3] = (a->x).n[3];
      secp256k1_fe_impl_normalize_weak(&u1);
      secp256k1_fe_impl_mul(&u2,&b->x,&z12);
      s1.n[4] = (a->y).n[4];
      s1.n[0] = (a->y).n[0];
      s1.n[1] = (a->y).n[1];
      s1.n[2] = (a->y).n[2];
      s1.n[3] = (a->y).n[3];
      secp256k1_fe_impl_normalize_weak(&s1);
      secp256k1_fe_impl_mul(&s2,&b->y,&z12);
      secp256k1_fe_impl_mul(&s2,&s2,&az);
      local_198.n[0] = (u2.n[0] - u1.n[0]) + 0x3ffffbfffff0bc;
      local_198.n[1] = (u2.n[1] - u1.n[1]) + 0x3ffffffffffffc;
      local_198.n[2] = (u2.n[2] - u1.n[2]) + 0x3ffffffffffffc;
      local_198.n[3] = (u2.n[3] - u1.n[3]) + 0x3ffffffffffffc;
      local_198.n[4] = (u2.n[4] - u1.n[4]) + 0x3fffffffffffc;
      local_218.n[0] = (s1.n[0] - s2.n[0]) + 0x3ffffbfffff0bc;
      local_218.n[1] = (s1.n[1] - s2.n[1]) + 0x3ffffffffffffc;
      local_218.n[2] = (s1.n[2] - s2.n[2]) + 0x3ffffffffffffc;
      local_218.n[3] = (s1.n[3] - s2.n[3]) + 0x3ffffffffffffc;
      local_218.n[4] = (s1.n[4] - s2.n[4]) + 0x3fffffffffffc;
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_198);
      if (iVar1 == 0) {
        r->infinity = 0;
        secp256k1_fe_impl_mul(&r->z,&a->z,&local_198);
        secp256k1_fe_impl_sqr(&local_d8,&local_198);
        local_d8.n[0] = 0x3ffffbfffff0bc - local_d8.n[0];
        local_d8.n[1] = 0x3ffffffffffffc - local_d8.n[1];
        local_d8.n[2] = 0x3ffffffffffffc - local_d8.n[2];
        local_d8.n[3] = 0x3ffffffffffffc - local_d8.n[3];
        local_d8.n[4] = 0x3fffffffffffc - local_d8.n[4];
        secp256k1_fe_impl_mul(&h3,&local_d8,&local_198);
        secp256k1_fe_impl_mul(&t,&u1,&local_d8);
        secp256k1_fe_impl_sqr(&r->x,&local_218);
        secp256k1_fe_impl_add(&r->x,&h3);
        secp256k1_fe_impl_add(&r->x,&t);
        secp256k1_fe_impl_add(&r->x,&t);
        secp256k1_fe_impl_add(&t,&r->x);
        secp256k1_fe_impl_mul(&r->y,&t,&local_218);
        secp256k1_fe_impl_mul(&h3,&h3,&s1);
        secp256k1_fe_impl_add(&r->y,&h3);
      }
      else {
        iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_218);
        if (iVar1 == 0) {
          secp256k1_gej_set_infinity(r);
        }
        else {
          secp256k1_gej_double_var(r,a,(secp256k1_fe *)0x0);
        }
      }
    }
    else {
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        (r->x).n[0] = (a->x).n[0];
        a = (secp256k1_gej *)((a->x).n + 1);
        r = (secp256k1_gej *)((r->x).n + 1);
      }
    }
  }
  else {
    r->infinity = b->infinity;
    secp256k1_fe_impl_sqr(&az,bzinv);
    secp256k1_fe_impl_mul(&z12,&az,bzinv);
    secp256k1_fe_impl_mul(&r->x,&b->x,&az);
    secp256k1_fe_impl_mul(&r->y,&b->y,&z12);
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_gej_add_zinv_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, const secp256k1_fe *bzinv) {
    /* 9 mul, 3 sqr, 13 add/negate/normalize_weak/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe az, z12, u1, u2, s1, s2, h, i, h2, h3, t;

    secp256k1_ge_verify(b);
    secp256k1_fe_verify(bzinv);
    if (a->infinity) {
        secp256k1_fe bzinv2, bzinv3;
        r->infinity = b->infinity;
        secp256k1_fe_sqr(&bzinv2, bzinv);
        secp256k1_fe_mul(&bzinv3, &bzinv2, bzinv);
        secp256k1_fe_mul(&r->x, &b->x, &bzinv2);
        secp256k1_fe_mul(&r->y, &b->y, &bzinv3);
        secp256k1_fe_set_int(&r->z, 1);
        return;
    }
    if (b->infinity) {
        *r = *a;
        return;
    }

    /** We need to calculate (rx,ry,rz) = (ax,ay,az) + (bx,by,1/bzinv). Due to
     *  secp256k1's isomorphism we can multiply the Z coordinates on both sides
     *  by bzinv, and get: (rx,ry,rz*bzinv) = (ax,ay,az*bzinv) + (bx,by,1).
     *  This means that (rx,ry,rz) can be calculated as
     *  (ax,ay,az*bzinv) + (bx,by,1), when not applying the bzinv factor to rz.
     *  The variable az below holds the modified Z coordinate for a, which is used
     *  for the computation of rx and ry, but not for rz.
     */
    secp256k1_fe_mul(&az, &a->z, bzinv);

    secp256k1_fe_sqr(&z12, &az);
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &az);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, NULL);
        } else {
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);
    secp256k1_gej_verify(r);
}